

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

int __thiscall QtMWidgets::ProgressBarPrivate::init(ProgressBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QPalette *pQVar2;
  QColor *pQVar3;
  QVariantAnimation *pQVar4;
  QVariant local_68;
  QVariant local_48;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_18;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_14;
  ProgressBarPrivate *pPStack_10;
  QSizePolicy sp;
  ProgressBarPrivate *this_local;
  
  pPStack_10 = this;
  pQVar2 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(pQVar2,Highlight);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)pQVar3;
  *(undefined4 *)((long)&(this->highlightColor).ct + 4) = *(undefined4 *)((long)&pQVar3->ct + 4);
  (this->highlightColor).ct.argb.pad = (pQVar3->ct).argb.pad;
  pQVar2 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(pQVar2,Dark);
  *(undefined8 *)&this->grooveColor = *(undefined8 *)pQVar3;
  *(undefined4 *)((long)&(this->grooveColor).ct + 4) = *(undefined4 *)((long)&pQVar3->ct + 4);
  (this->grooveColor).ct.argb.pad = (pQVar3->ct).argb.pad;
  pQVar2 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(pQVar2,Base);
  *(undefined8 *)&this->animationColor = *(undefined8 *)pQVar3;
  *(undefined4 *)((long)&(this->animationColor).ct + 4) = *(undefined4 *)((long)&pQVar3->ct + 4);
  (this->animationColor).ct.argb.pad = (pQVar3->ct).argb.pad;
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_14.bits,Expanding,Fixed,DefaultType);
  if (this->orientation == Vertical) {
    QSizePolicy::transpose((QSizePolicy *)&local_14.bits);
  }
  local_18 = local_14;
  QWidget::setSizePolicy((QSizePolicy *)this->q);
  pQVar4 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar4,(QObject *)this->q);
  this->animation = pQVar4;
  QVariantAnimation::setDuration((int)this->animation);
  QAbstractAnimation::setLoopCount((int)this->animation);
  pQVar4 = this->animation;
  QVariant::QVariant(&local_48,0.0);
  QVariantAnimation::setStartValue((QVariant *)pQVar4);
  QVariant::~QVariant(&local_48);
  pQVar4 = this->animation;
  QVariant::QVariant(&local_68,1.0);
  QVariantAnimation::setEndValue((QVariant *)pQVar4);
  QVariant::~QVariant(&local_68);
  iVar1 = QAbstractAnimation::start(this->animation,0);
  return iVar1;
}

Assistant:

void
ProgressBarPrivate::init()
{
	highlightColor = q->palette().color( QPalette::Highlight );
	grooveColor = q->palette().color( QPalette::Dark );
	animationColor = q->palette().color( QPalette::Base );

	QSizePolicy sp( QSizePolicy::Expanding, QSizePolicy::Fixed );
	if( orientation == Qt::Vertical )
		sp.transpose();

	q->setSizePolicy( sp );

	animation = new QVariantAnimation( q );
	animation->setDuration( 500 );
	animation->setLoopCount( -1 );
	animation->setStartValue( 0.0 );
	animation->setEndValue( 1.0 );
	animation->start();
}